

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

QPainterPath __thiscall
QPainterPathStroker::createStroke(QPainterPathStroker *this,QPainterPath *path)

{
  long lVar1;
  bool bVar2;
  QPainterPathStrokerPrivate *this_00;
  QStroker *in_RDX;
  QExplicitlySharedDataPointer<QPainterPathPrivate> in_RDI;
  long in_FS_OFFSET;
  QPainterPathStrokerPrivate *d;
  QDashStroker dashStroker;
  QPainterPath stroke;
  QStroker *in_stack_fffffffffffffe38;
  QPainterPathStrokerPrivate *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  FillRule fillRule;
  QExplicitlySharedDataPointer<QPainterPathPrivate> this_01;
  QRectF local_178;
  undefined1 local_158 [40];
  QTransform *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  QPainterPath *in_stack_fffffffffffffee0;
  QStrokerOps *in_stack_fffffffffffffee8;
  
  fillRule = (FillRule)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01.d.ptr = in_RDI.d.ptr;
  this_00 = d_func((QPainterPathStroker *)0x5bd442);
  QPainterPath::QPainterPath((QPainterPath *)0x5bd463);
  bVar2 = QPainterPath::isEmpty((QPainterPath *)this_01.d.ptr);
  if (bVar2) {
    QPainterPath::QPainterPath
              ((QPainterPath *)in_stack_fffffffffffffe40,(QPainterPath *)in_stack_fffffffffffffe38);
  }
  else {
    bVar2 = QList<double>::isEmpty((QList<double> *)0x5bd4a0);
    if (bVar2) {
      QTransform::QTransform((QTransform *)this_00);
      fillRule = (FillRule)((ulong)in_RDX >> 0x20);
      QStrokerOps::strokePath
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0);
    }
    else {
      memcpy(local_158,&DAT_00bc0c48,0xa8);
      QDashStroker::QDashStroker
                ((QDashStroker *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      QDashStroker::setDashPattern
                ((QDashStroker *)in_stack_fffffffffffffe40,
                 (QList<double> *)in_stack_fffffffffffffe38);
      QDashStroker::setDashOffset((QDashStroker *)local_158,this_00->dashOffset);
      QStrokerOps::clipRect(&local_178,(QStrokerOps *)this_00);
      QStrokerOps::setClipRect((QStrokerOps *)local_158,&local_178);
      QTransform::QTransform((QTransform *)in_stack_fffffffffffffe40);
      QStrokerOps::strokePath
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0);
      QDashStroker::~QDashStroker((QDashStroker *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe38 = in_RDX;
      this_00 = in_stack_fffffffffffffe40;
    }
    QPainterPath::setFillRule((QPainterPath *)this_01.d.ptr,fillRule);
    QPainterPath::QPainterPath((QPainterPath *)this_00,(QPainterPath *)in_stack_fffffffffffffe38);
  }
  QPainterPath::~QPainterPath((QPainterPath *)0x5bd5d2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPathStroker::createStroke(const QPainterPath &path) const
{
    QPainterPathStrokerPrivate *d = const_cast<QPainterPathStrokerPrivate *>(d_func());
    QPainterPath stroke;
    if (path.isEmpty())
        return path;
    if (d->dashPattern.isEmpty()) {
        d->stroker.strokePath(path, &stroke, QTransform());
    } else {
        QDashStroker dashStroker(&d->stroker);
        dashStroker.setDashPattern(d->dashPattern);
        dashStroker.setDashOffset(d->dashOffset);
        dashStroker.setClipRect(d->stroker.clipRect());
        dashStroker.strokePath(path, &stroke, QTransform());
    }
    stroke.setFillRule(Qt::WindingFill);
    return stroke;
}